

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64func.cpp
# Opt level: O2

Error asmjit::v1_14::a64::FuncInternal::initFuncDetail(FuncDetail *func,FuncSignature *signature)

{
  RegType RVar1;
  FuncDetail FVar2;
  Error EVar3;
  FuncValue *pFVar4;
  RegOrder *pRVar5;
  uint32_t uVar6;
  byte bVar7;
  TypeId TVar8;
  uint uVar9;
  uint32_t valueIndex;
  size_t index;
  uint uVar11;
  ulong uVar12;
  FuncDetail *pFVar13;
  bool bVar14;
  RegGroup local_5a [2];
  ulong local_58;
  uint local_4c;
  uint local_48;
  uint local_44;
  FuncDetail *local_40;
  FuncDetail *local_38;
  ulong uVar10;
  
  uVar12 = (ulong)(byte)func[0x74];
  FVar2 = func[2];
  bVar7 = FVar2 != (FuncDetail)0x3;
  local_40 = func;
  if (*(int *)(func + 0x8c) != 0) {
    local_58 = CONCAT71(local_58._1_7_,FVar2 != (FuncDetail)0x3);
    pFVar13 = func + 0x8c;
    uVar11 = 0;
    for (index = 0; index != 4; index = index + 1) {
      pFVar4 = FuncValuePack::operator[]((FuncValuePack *)pFVar13,index);
      uVar9 = pFVar4->_data & 0xff;
      uVar10 = (ulong)uVar9;
      TVar8 = (TypeId)pFVar4->_data;
      if (TVar8 < _kFloatStart) {
        if ((0x5400000000U >> (uVar10 & 0x3f) & 1) == 0) {
          if ((0xa800000000U >> (uVar10 & 0x3f) & 1) == 0) {
            if ((0x30000000000U >> (uVar10 & 0x3f) & 1) == 0) goto LAB_001319d5;
            pFVar4 = FuncValuePack::operator[]((FuncValuePack *)pFVar13,index);
            uVar6 = uVar9 + uVar11 + 0x7000100;
          }
          else {
            pFVar4 = FuncValuePack::operator[]((FuncValuePack *)pFVar13,index);
            uVar6 = uVar11 | 0x6000127;
          }
        }
        else {
          pFVar4 = FuncValuePack::operator[]((FuncValuePack *)pFVar13,index);
          uVar6 = uVar11 | 0x6000126;
        }
        pFVar4->_data = uVar6;
      }
      else {
LAB_001319d5:
        if (uVar9 == 0) break;
        RVar1 = regTypeFromFpOrVecTypeId(TVar8);
        if (RVar1 == kNone) {
          return 0x1b;
        }
        pFVar4 = FuncValuePack::operator[]((FuncValuePack *)pFVar13,index);
        pFVar4->_data = ((uint)RVar1 << 0x18 | uVar9) + uVar11 + 0x100;
      }
      uVar11 = uVar11 + 0x10000;
    }
    FVar2 = local_40[2];
    bVar7 = (byte)local_58;
  }
  if ((FVar2 == (FuncDetail)0x3) || (FVar2 == (FuncDetail)0x0)) {
    local_44 = (uint)bVar7 * 4 + 4;
    pFVar13 = local_40 + 0x9c;
    local_38 = local_40 + 0x34;
    local_4c = 0;
    uVar10 = 0;
    local_58 = 0;
    while (bVar14 = uVar12 != 0, uVar12 = uVar12 - 1, bVar14) {
      uVar11 = *(uint *)pFVar13 & 0xff;
      uVar9 = (uint)uVar10;
      TVar8 = (TypeId)*(uint *)pFVar13;
      if (uVar11 - 0x20 < 10) {
        if (uVar9 < 0x10) {
          local_5a[1] = 0;
          pRVar5 = Support::Array<asmjit::v1_14::CallConv::RegOrder,_4UL>::
                   operator[]<asmjit::v1_14::RegGroup>
                             ((Array<asmjit::v1_14::CallConv::RegOrder,_4UL> *)local_38,local_5a + 1
                             );
          bVar7 = pRVar5->id[uVar10];
          if (bVar7 != 0xff) {
            FuncValue::assignRegData((FuncValue *)pFVar13,kARM_GpX - (TVar8 < kInt64),(uint)bVar7);
            FuncDetail::addUsedRegs(local_40,k0,1 << (bVar7 & 0x1f));
            uVar10 = (ulong)(uVar9 + 1);
            goto LAB_00131bf7;
          }
        }
        uVar9 = (uint)(byte)TypeUtils::_typeData[(ulong)uVar11 + 0x100];
        if ((byte)TypeUtils::_typeData[(ulong)uVar11 + 0x100] < local_44) {
          uVar9 = local_44;
        }
        uVar11 = (uint)local_58 + 7 & 0xfffffff8;
        if (uVar9 < 8) {
          uVar11 = (uint)local_58;
        }
        FuncValue::assignStackOffset((FuncValue *)pFVar13,uVar11);
        local_58 = (ulong)(uVar11 + uVar9);
      }
      else if (uVar11 - 0x33 < 0x32 || uVar11 - 0x2a < 3) {
        local_48 = uVar9;
        if (local_4c < 0x10) {
          local_5a[0] = kVec;
          pRVar5 = Support::Array<asmjit::v1_14::CallConv::RegOrder,_4UL>::
                   operator[]<asmjit::v1_14::RegGroup>
                             ((Array<asmjit::v1_14::CallConv::RegOrder,_4UL> *)local_38,local_5a);
          bVar7 = pRVar5->id[local_4c];
          if (bVar7 == 0xff) goto LAB_00131bb2;
          RVar1 = regTypeFromFpOrVecTypeId(TVar8);
          if (RVar1 == kNone) {
            return 0x1b;
          }
          *(uint *)pFVar13 = uVar11;
          FuncValue::assignRegData((FuncValue *)pFVar13,RVar1,(uint)bVar7);
          FuncDetail::addUsedRegs(local_40,kVec,1 << (bVar7 & 0x1f));
          local_4c = local_4c + 1;
        }
        else {
LAB_00131bb2:
          uVar9 = (uint)(byte)TypeUtils::_typeData[(ulong)uVar11 + 0x100];
          if ((byte)TypeUtils::_typeData[(ulong)uVar11 + 0x100] < local_44) {
            uVar9 = local_44;
          }
          uVar11 = (uint)local_58 + 7 & 0xfffffff8;
          if (uVar9 < 8) {
            uVar11 = (uint)local_58;
          }
          FuncValue::assignStackOffset((FuncValue *)pFVar13,uVar11);
          local_58 = (ulong)(uVar11 + uVar9);
        }
        uVar10 = (ulong)local_48;
      }
LAB_00131bf7:
      pFVar13 = pFVar13 + 0x10;
    }
    *(uint *)(local_40 + 0x88) = (int)local_58 + 7U & 0xfffffff8;
    EVar3 = 0;
  }
  else {
    EVar3 = 3;
  }
  return EVar3;
}

Assistant:

ASMJIT_FAVOR_SIZE Error initFuncDetail(FuncDetail& func, const FuncSignature& signature) noexcept {
  DebugUtils::unused(signature);

  const CallConv& cc = func.callConv();
  uint32_t stackOffset = 0;

  uint32_t i;
  uint32_t argCount = func.argCount();

  // Minimum stack size of a single argument passed via stack. The standard AArch64 calling convention
  // specifies 8 bytes, so each function argument would occupy at least 8 bytes even if it needs less.
  // However, Apple has decided to not follow this rule and function argument can occupy less, for
  // example two consecutive 32-bit arguments would occupy 8 bytes total, instead of 16 as specified
  // by ARM.
  uint32_t minStackArgSize = cc.strategy() == CallConvStrategy::kAArch64Apple ? 4u : 8u;

  if (func.hasRet()) {
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      TypeId typeId = func._rets[valueIndex].typeId();

      // Terminate at the first void type (end of the pack).
      if (typeId == TypeId::kVoid)
        break;

      switch (typeId) {
        case TypeId::kInt8:
        case TypeId::kInt16:
        case TypeId::kInt32: {
          func._rets[valueIndex].initReg(RegType::kARM_GpW, valueIndex, TypeId::kInt32);
          break;
        }

        case TypeId::kUInt8:
        case TypeId::kUInt16:
        case TypeId::kUInt32: {
          func._rets[valueIndex].initReg(RegType::kARM_GpW, valueIndex, TypeId::kUInt32);
          break;
        }

        case TypeId::kInt64:
        case TypeId::kUInt64: {
          func._rets[valueIndex].initReg(RegType::kARM_GpX, valueIndex, typeId);
          break;
        }

        default: {
          RegType regType = regTypeFromFpOrVecTypeId(typeId);
          if (regType == RegType::kNone)
            return DebugUtils::errored(kErrorInvalidRegType);

          func._rets[valueIndex].initReg(regType, valueIndex, typeId);
          break;
        }
      }
    }
  }

  switch (cc.strategy()) {
    case CallConvStrategy::kDefault:
    case CallConvStrategy::kAArch64Apple: {
      uint32_t gpzPos = 0;
      uint32_t vecPos = 0;

      for (i = 0; i < argCount; i++) {
        FuncValue& arg = func._args[i][0];
        TypeId typeId = arg.typeId();

        if (TypeUtils::isInt(typeId)) {
          uint32_t regId = BaseReg::kIdBad;

          if (gpzPos < CallConv::kMaxRegArgsPerGroup)
            regId = cc._passedOrder[RegGroup::kGp].id[gpzPos];

          if (regId != BaseReg::kIdBad) {
            RegType regType = typeId <= TypeId::kUInt32 ? RegType::kARM_GpW : RegType::kARM_GpX;
            arg.assignRegData(regType, regId);
            func.addUsedRegs(RegGroup::kGp, Support::bitMask(regId));
            gpzPos++;
          }
          else {
            uint32_t size = Support::max<uint32_t>(TypeUtils::sizeOf(typeId), minStackArgSize);
            if (size >= 8)
              stackOffset = Support::alignUp(stackOffset, 8);
            arg.assignStackOffset(int32_t(stackOffset));
            stackOffset += size;
          }
          continue;
        }

        if (TypeUtils::isFloat(typeId) || TypeUtils::isVec(typeId)) {
          uint32_t regId = BaseReg::kIdBad;

          if (vecPos < CallConv::kMaxRegArgsPerGroup)
            regId = cc._passedOrder[RegGroup::kVec].id[vecPos];

          if (regId != BaseReg::kIdBad) {
            RegType regType = regTypeFromFpOrVecTypeId(typeId);
            if (regType == RegType::kNone)
              return DebugUtils::errored(kErrorInvalidRegType);

            arg.initTypeId(typeId);
            arg.assignRegData(regType, regId);
            func.addUsedRegs(RegGroup::kVec, Support::bitMask(regId));
            vecPos++;
          }
          else {
            uint32_t size = Support::max<uint32_t>(TypeUtils::sizeOf(typeId), minStackArgSize);
            if (size >= 8)
              stackOffset = Support::alignUp(stackOffset, 8);
            arg.assignStackOffset(int32_t(stackOffset));
            stackOffset += size;
          }
          continue;
        }
      }
      break;
    }

    default:
      return DebugUtils::errored(kErrorInvalidState);
  }

  func._argStackSize = Support::alignUp(stackOffset, 8u);
  return kErrorOk;
}